

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O2

X509_EXTENSION * X509V3_EXT_nconf_nid(CONF *conf,X509V3_CTX *ctx,int ext_nid,char *value)

{
  int crit;
  int gen_type;
  char *ext;
  X509_EXTENSION *pXVar1;
  char *local_60;
  undefined8 local_58;
  X509 *pXStack_50;
  X509 *local_48;
  X509_REQ *pXStack_40;
  X509_CRL *local_38;
  X509V3_CONF_METHOD *local_30;
  
  if (ctx == (X509V3_CTX *)0x0) {
    ctx = (X509V3_CTX *)&local_58;
    local_48 = (X509 *)0x0;
    pXStack_40 = (X509_REQ *)0x0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    pXStack_50 = (X509 *)0x0;
    local_38 = (X509_CRL *)0x0;
    local_30 = (X509V3_CONF_METHOD *)conf;
  }
  local_60 = value;
  crit = v3_check_critical(&local_60);
  gen_type = v3_check_generic(&local_60);
  if (gen_type == 0) {
    pXVar1 = (X509_EXTENSION *)do_ext_nconf((CONF *)conf,(X509V3_CTX *)ctx,ext_nid,crit,local_60);
  }
  else {
    ext = OBJ_nid2sn(ext_nid);
    pXVar1 = (X509_EXTENSION *)v3_generic_extension(ext,local_60,crit,gen_type,(X509V3_CTX *)ctx);
  }
  return pXVar1;
}

Assistant:

X509_EXTENSION *X509V3_EXT_nconf_nid(const CONF *conf, const X509V3_CTX *ctx,
                                     int ext_nid, const char *value) {
  // If omitted, fill in an empty |X509V3_CTX|.
  X509V3_CTX ctx_tmp;
  if (ctx == NULL) {
    X509V3_set_ctx(&ctx_tmp, NULL, NULL, NULL, NULL, 0);
    X509V3_set_nconf(&ctx_tmp, conf);
    ctx = &ctx_tmp;
  }

  int crit = v3_check_critical(&value);
  int ext_type = v3_check_generic(&value);
  if (ext_type != 0) {
    return v3_generic_extension(OBJ_nid2sn(ext_nid), value, crit, ext_type,
                                ctx);
  }
  return do_ext_nconf(conf, ctx, ext_nid, crit, value);
}